

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharInfo.h
# Opt level: O1

char * slang::utf8Decode(char *b,uint32_t *c,int *e)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  
  uVar1 = (uint)((byte)*b >> 3);
  lVar3 = (long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"[uVar1];
  uVar2 = ((uint)(byte)*b & *(uint *)(&DAT_003cdbc0 + lVar3 * 4)) << 0x12;
  *c = uVar2;
  uVar2 = ((byte)b[1] & 0x3f) << 0xc | uVar2;
  *c = uVar2;
  uVar2 = ((byte)b[2] & 0x3f) << 6 | uVar2;
  *c = uVar2;
  uVar2 = ((byte)b[3] & 0x3f | uVar2) >> ((&DAT_003cdc00)[lVar3 * 4] & 0x1f);
  *c = uVar2;
  uVar2 = (uint)(uVar2 < *(uint *)(&DAT_003cdbe0 + lVar3 * 4)) << 6;
  *e = uVar2;
  uVar2 = (uint)((*c & 0xfffff800) == 0xd800) << 7 | uVar2;
  *e = uVar2;
  uVar2 = (uint)(0x10ffff < *c) << 8 | uVar2;
  *e = uVar2;
  uVar2 = (byte)b[1] >> 2 & 0x30 | uVar2;
  *e = uVar2;
  uVar2 = (byte)b[2] >> 4 & 0xc | uVar2;
  *e = uVar2;
  *e = (((byte)b[3] >> 6 | uVar2) ^ 0x2a) >> ((&DAT_003cdc20)[lVar3 * 4] & 0x1f);
  return b + (ulong)((0x80ff0000U >> uVar1 & 1) != 0) + lVar3;
}

Assistant:

constexpr const char* utf8Decode(const char* b, uint32_t* c, int* e) {
    constexpr const int masks[] = {0x00, 0x7f, 0x1f, 0x0f, 0x07};
    constexpr const uint32_t mins[] = {4194304, 0, 128, 2048, 65536};
    constexpr const int shiftc[] = {0, 18, 12, 6, 0};
    constexpr const int shifte[] = {0, 6, 4, 2, 0};

    using uc = unsigned char;
    int len = utf8Len(uc(*b));

    // Compute the pointer to the next character early so that the next
    // iteration can start working on the next character. Neither Clang
    // nor GCC figure out this reordering on their own.
    const char* next = b + len + !len;

    // Assume a four-byte character and load four bytes. Unused bits are
    // shifted out.
    *c = (uint32_t)(uc(b[0]) & masks[len]) << 18;
    *c |= (uint32_t)(uc(b[1]) & 0x3f) << 12;
    *c |= (uint32_t)(uc(b[2]) & 0x3f) << 6;
    *c |= (uint32_t)(uc(b[3]) & 0x3f) << 0;
    *c >>= shiftc[len];

    // Accumulate the various error conditions.
    *e = (*c < mins[len]) << 6;      // non-canonical encoding
    *e |= ((*c >> 11) == 0x1b) << 7; // surrogate half?
    *e |= (*c > 0x10FFFF) << 8;      // out of range?
    *e |= (uc(b[1]) & 0xc0) >> 2;
    *e |= (uc(b[2]) & 0xc0) >> 4;
    *e |= (uc(b[3])) >> 6;
    *e ^= 0x2a; // top two bits of each tail byte correct?
    *e >>= shifte[len];

    return next;
}